

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGLogBestError(xmlRelaxNGValidCtxtPtr ctxt)

{
  uint uVar1;
  xmlRelaxNGStatesPtr pxVar2;
  xmlRelaxNGValidStatePtr pxVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  int iVar7;
  
  pxVar2 = ctxt->states;
  if (pxVar2 != (xmlRelaxNGStatesPtr)0x0) {
    uVar1 = pxVar2->nbState;
    if (0 < (int)uVar1) {
      iVar7 = 1000000;
      uVar5 = 0xffffffff;
      for (uVar6 = 0; uVar4 = (uint)uVar5, uVar1 != uVar6; uVar6 = uVar6 + 1) {
        pxVar3 = pxVar2->tabState[uVar6];
        if (pxVar3 != (xmlRelaxNGValidStatePtr)0x0) {
          if (pxVar3->seq == (xmlNodePtr)0x0) {
            if (pxVar3->nbAttrLeft < iVar7 || uVar4 == 0xffffffff) {
              uVar5 = uVar6 & 0xffffffff;
              iVar7 = pxVar3->nbAttrLeft;
            }
          }
          else if (100000 < iVar7 || uVar4 == 0xffffffff) {
            uVar5 = uVar6 & 0xffffffff;
            iVar7 = 100000;
          }
        }
      }
      if (uVar4 < uVar1) {
        ctxt->state = pxVar2->tabState[uVar5];
        xmlRelaxNGValidateElementEnd(ctxt,1);
        return;
      }
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGLogBestError(xmlRelaxNGValidCtxtPtr ctxt)
{
    int best;

    if ((ctxt == NULL) || (ctxt->states == NULL) ||
        (ctxt->states->nbState <= 0))
        return;

    best = xmlRelaxNGBestState(ctxt);
    if ((best >= 0) && (best < ctxt->states->nbState)) {
        ctxt->state = ctxt->states->tabState[best];

        xmlRelaxNGValidateElementEnd(ctxt, 1);
    }
}